

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

char * mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
       GetTypeName(void)

{
  int iVar1;
  char *__rhs;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>::GetTypeName()::
      name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>
                                 ::GetTypeName()::name_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"IndicatorConstraint[",&local_49);
      __rhs = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::GetTypeName();
      std::operator+(&local_28,&local_48,__rhs);
      std::operator+(&IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>::
                      GetTypeName()::name_abi_cxx11_,&local_28,']');
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_48);
      __cxa_atexit(std::__cxx11::string::~string,
                   &IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>::
                    GetTypeName()::name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>
                           ::GetTypeName()::name_abi_cxx11_);
    }
  }
  return IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>::GetTypeName()
         ::name_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

static const char* GetTypeName() {
    static std::string name
        { std::string("IndicatorConstraint[") + Con::GetTypeName() + ']' };
    return name.c_str();
  }